

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_ConstLocalIterators_Test<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_ConstLocalIterators_Test<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  local_iterator it;
  local_iterator it_00;
  local_iterator it_01;
  local_iterator it_02;
  bool bVar1;
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_RDI;
  AssertionResult gtest_ar__2;
  const_local_iterator e2;
  const_local_iterator b2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  const_local_iterator e;
  const_local_iterator b;
  size_type bucknum;
  key_type *in_stack_fffffffffffffb58;
  const_iterator *it_03;
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffb60;
  const_local_iterator *this_00;
  HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffb68;
  sparse_hashtable_const_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *this_01;
  int in_stack_fffffffffffffb7c;
  int line;
  int iVar2;
  HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffb80;
  char *file;
  Type TVar3;
  AssertHelper *this_02;
  undefined8 in_stack_fffffffffffffba8;
  nonempty_iterator ppVar4;
  int *expected_predicate_value;
  char *actual_predicate_value;
  char *in_stack_fffffffffffffbd0;
  AssertionResult *in_stack_fffffffffffffbd8;
  AssertHelper *in_stack_fffffffffffffbe0;
  size_type in_stack_fffffffffffffbf8;
  undefined7 in_stack_fffffffffffffc00;
  undefined1 in_stack_fffffffffffffc07;
  AssertionResult local_3f8;
  const_iterator *local_3e8;
  const_local_iterator *pcStack_3e0;
  char *pcStack_3d0;
  undefined8 local_3c8;
  char *pcStack_3c0;
  undefined8 local_3b8;
  AssertHelper *pAStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  value_type *in_stack_fffffffffffffc98;
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffca0;
  const_local_iterator *pcStack_340;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  string local_2a8 [55];
  undefined1 local_271;
  AssertionResult local_270 [5];
  string local_218 [55];
  undefined1 local_1e1;
  AssertionResult local_1e0;
  const_iterator *local_1d0;
  const_local_iterator *pcStack_1c8;
  undefined8 local_1c0;
  int iStack_1bc;
  sparse_hashtable_const_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *psStack_1b8;
  undefined8 local_1b0;
  char *pcStack_1a8;
  undefined8 local_1a0;
  AssertHelper *pAStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  const_local_iterator *pcStack_128;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  key_type local_90;
  size_type local_88;
  char local_18 [24];
  
  expected_predicate_value =
       &(in_RDI->ht_).rep.settings.
        super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.super_Hasher.
        num_compares_;
  actual_predicate_value = local_18;
  HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject(in_stack_fffffffffffffb68,(int)((ulong)in_stack_fffffffffffffb60 >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0xaea805);
  ppVar4 = (nonempty_iterator)
           &(in_RDI->ht_).rep.settings.
            super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.super_Hasher.
            num_compares_;
  local_90 = HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffffb80,in_stack_fffffffffffffb7c);
  local_88 = google::
             BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ::bucket(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin((BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),in_stack_fffffffffffffbf8
         );
  it.super_local_iterator.pos.row_begin._M_current._0_4_ = (int)local_110;
  it.super_local_iterator.ht =
       (sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)uStack_118;
  it.super_local_iterator.pos.row_begin._M_current._4_4_ = (int)((ulong)local_110 >> 0x20);
  it.super_local_iterator.pos.row_end._M_current =
       (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
        *)uStack_108;
  it.super_local_iterator.pos.row_current._M_current._0_4_ = (int)local_100;
  it.super_local_iterator.pos.row_current._M_current._4_4_ = (int)((ulong)local_100 >> 0x20);
  it.super_local_iterator.pos.col_current = (nonempty_iterator)uStack_f8;
  it.super_local_iterator.end.row_begin._M_current =
       (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
        *)local_f0;
  it.super_local_iterator.end.row_end._M_current =
       (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
        *)uStack_e8;
  it.super_local_iterator.end.row_current._M_current =
       (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffffba8;
  it.super_local_iterator.end.col_current = ppVar4;
  it.parent_ = in_RDI;
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::const_local_iterator::const_local_iterator(pcStack_128,it);
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::end((BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
         *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),in_stack_fffffffffffffbf8);
  TVar3 = (Type)((ulong)local_1a0 >> 0x20);
  line = (int)((ulong)local_1b0 >> 0x20);
  it_00.super_local_iterator.pos.row_begin._M_current._0_4_ = (int)local_1b0;
  it_00.super_local_iterator.ht =
       (sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)psStack_1b8;
  it_00.super_local_iterator.pos.row_begin._M_current._4_4_ = line;
  it_00.super_local_iterator.pos.row_end._M_current =
       (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
        *)pcStack_1a8;
  it_00.super_local_iterator.pos.row_current._M_current._0_4_ = (int)local_1a0;
  it_00.super_local_iterator.pos.row_current._M_current._4_4_ = TVar3;
  it_00.super_local_iterator.pos.col_current = (nonempty_iterator)pAStack_198;
  it_00.super_local_iterator.end.row_begin._M_current =
       (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
        *)local_190;
  it_00.super_local_iterator.end.row_end._M_current =
       (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
        *)uStack_188;
  it_00.super_local_iterator.end.row_current._M_current =
       (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffffba8;
  it_00.super_local_iterator.end.col_current = ppVar4;
  it_00.parent_ = in_RDI;
  iVar2 = iStack_1bc;
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::const_local_iterator::const_local_iterator(pcStack_1c8,it_00);
  local_1e1 = google::
              sparse_hashtable_const_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=(&pcStack_1c8->super_const_local_iterator,local_1d0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)pcStack_1c8,(bool *)local_1d0,(type *)0xaea94b);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1e0);
  it_03 = local_1d0;
  this_00 = pcStack_1c8;
  this_01 = psStack_1b8;
  file = pcStack_1a8;
  this_02 = pAStack_198;
  if (!bVar1) {
    testing::Message::Message((Message *)pAStack_198);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,actual_predicate_value,
               (char *)expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (pAStack_198,TVar3,pcStack_1a8,line,(char *)psStack_1b8);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffbe0,(Message *)in_stack_fffffffffffffbd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)pcStack_1c8);
    std::__cxx11::string::~string(local_218);
    testing::Message::~Message((Message *)0xaeaa32);
    it_03 = local_1d0;
    this_00 = pcStack_1c8;
    this_01 = psStack_1b8;
    file = pcStack_1a8;
    this_02 = pAStack_198;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xaeaac6);
  google::
  sparse_hashtable_const_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::operator++(this_01,iVar2);
  local_271 = google::
              sparse_hashtable_const_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator==(&this_00->super_const_local_iterator,it_03);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_00,(bool *)it_03,(type *)0xaeab14);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_270);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,actual_predicate_value,
               (char *)expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(this_02,TVar3,file,line,(char *)this_01);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffbe0,(Message *)in_stack_fffffffffffffbd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    std::__cxx11::string::~string(local_2a8);
    testing::Message::~Message((Message *)0xaeabe7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xaeac7e);
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin((BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),in_stack_fffffffffffffbf8
         );
  it_01.super_local_iterator.pos.row_begin._M_current._0_4_ = (int)local_328;
  it_01.super_local_iterator.ht =
       (sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)uStack_330;
  it_01.super_local_iterator.pos.row_begin._M_current._4_4_ = (int)((ulong)local_328 >> 0x20);
  it_01.super_local_iterator.pos.row_end._M_current =
       (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
        *)uStack_320;
  it_01.super_local_iterator.pos.row_current._M_current._0_4_ = (int)local_318;
  it_01.super_local_iterator.pos.row_current._M_current._4_4_ = (int)((ulong)local_318 >> 0x20);
  it_01.super_local_iterator.pos.col_current = (nonempty_iterator)uStack_310;
  it_01.super_local_iterator.end.row_begin._M_current =
       (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
        *)local_308;
  it_01.super_local_iterator.end.row_end._M_current =
       (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
        *)uStack_300;
  it_01.super_local_iterator.end.row_current._M_current =
       (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffffba8;
  it_01.super_local_iterator.end.col_current = ppVar4;
  it_01.parent_ = in_RDI;
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::const_local_iterator::const_local_iterator(pcStack_340,it_01);
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::end((BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
         *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),in_stack_fffffffffffffbf8);
  TVar3 = (Type)((ulong)local_3b8 >> 0x20);
  iVar2 = (int)((ulong)local_3c8 >> 0x20);
  it_02.super_local_iterator.pos.row_begin._M_current._0_4_ = (int)local_3c8;
  it_02.super_local_iterator.ht =
       (sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)pcStack_3d0;
  it_02.super_local_iterator.pos.row_begin._M_current._4_4_ = iVar2;
  it_02.super_local_iterator.pos.row_end._M_current =
       (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
        *)pcStack_3c0;
  it_02.super_local_iterator.pos.row_current._M_current._0_4_ = (int)local_3b8;
  it_02.super_local_iterator.pos.row_current._M_current._4_4_ = TVar3;
  it_02.super_local_iterator.pos.col_current = (nonempty_iterator)pAStack_3b0;
  it_02.super_local_iterator.end.row_begin._M_current =
       (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
        *)local_3a8;
  it_02.super_local_iterator.end.row_end._M_current =
       (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
        *)uStack_3a0;
  it_02.super_local_iterator.end.row_current._M_current =
       (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffffba8;
  it_02.super_local_iterator.end.col_current = ppVar4;
  it_02.parent_ = in_RDI;
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::const_local_iterator::const_local_iterator(pcStack_3e0,it_02);
  google::
  sparse_hashtable_const_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::operator==(&pcStack_3e0->super_const_local_iterator,local_3e8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)pcStack_3e0,(bool *)local_3e8,(type *)0xaead8f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3f8);
  if (!bVar1) {
    testing::Message::Message((Message *)pAStack_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,actual_predicate_value,
               (char *)expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(pAStack_3b0,TVar3,pcStack_3c0,iVar2,pcStack_3d0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffbe0,(Message *)in_stack_fffffffffffffbd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)pcStack_3e0);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffbd0);
    testing::Message::~Message((Message *)0xaeae59);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xaeaee4);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, ConstLocalIterators) {
  this->ht_.insert(this->UniqueObject(1));
  const typename TypeParam::size_type bucknum =
      this->ht_.bucket(this->UniqueKey(1));
  typename TypeParam::const_local_iterator b = this->ht_.begin(bucknum);
  typename TypeParam::const_local_iterator e = this->ht_.end(bucknum);
  EXPECT_TRUE(b != e);
  b++;
  EXPECT_TRUE(b == e);
  typename TypeParam::const_local_iterator b2 = this->ht_.begin(bucknum ^ 1);
  typename TypeParam::const_local_iterator e2 = this->ht_.end(bucknum ^ 1);
  EXPECT_TRUE(b2 == e2);
}